

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalStringConcatenate
          (Evaluator *this,Token *op,GCPtr<symbols::Object> *left,GCPtr<symbols::Object> *right)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  Object *t;
  size_type sVar7;
  _Alloc_hider _Var8;
  bool value;
  string rightValue;
  string leftValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  lVar5 = __dynamic_cast(left->addr,&symbols::Object::typeinfo,&symbols::StringObject::typeinfo,0);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,*(long *)(lVar5 + 0x10),
             *(long *)(lVar5 + 0x18) + *(long *)(lVar5 + 0x10));
  lVar5 = __dynamic_cast(right->addr,&symbols::Object::typeinfo,&symbols::StringObject::typeinfo,0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,*(long *)(lVar5 + 0x10),
             *(long *)(lVar5 + 0x18) + *(long *)(lVar5 + 0x10));
  switch(op->Type) {
  case EQ:
    if (local_b0._M_string_length == local_d0._M_string_length) {
      if (local_b0._M_string_length == 0) {
        value = true;
      }
      else {
        iVar3 = bcmp(local_b0._M_dataplus._M_p,local_d0._M_dataplus._M_p,local_b0._M_string_length);
        value = iVar3 == 0;
      }
    }
    else {
LAB_0011c5cf:
      value = false;
    }
    break;
  case NOT_EQ:
    value = true;
    if (local_b0._M_string_length == local_d0._M_string_length) {
      if (local_b0._M_string_length == 0) goto LAB_0011c5cf;
      iVar3 = bcmp(local_b0._M_dataplus._M_p,local_d0._M_dataplus._M_p,local_b0._M_string_length);
      value = iVar3 != 0;
    }
    break;
  case GT:
    sVar7 = local_b0._M_string_length;
    if (local_d0._M_string_length < local_b0._M_string_length) {
      sVar7 = local_d0._M_string_length;
    }
    if (sVar7 == 0) {
LAB_0011c4b3:
      uVar6 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_b0._M_string_length - local_d0._M_string_length)) {
        uVar6 = local_b0._M_string_length - local_d0._M_string_length;
      }
      if (0x7ffffffe < (long)uVar6) {
        uVar6 = 0x7fffffff;
      }
    }
    else {
      uVar4 = memcmp(local_b0._M_dataplus._M_p,local_d0._M_dataplus._M_p,sVar7);
      uVar6 = (ulong)uVar4;
      if (uVar4 == 0) goto LAB_0011c4b3;
    }
    value = 0 < (int)uVar6;
    break;
  case LT:
    sVar7 = local_b0._M_string_length;
    if (local_d0._M_string_length < local_b0._M_string_length) {
      sVar7 = local_d0._M_string_length;
    }
    if (sVar7 == 0) {
LAB_0011c543:
      uVar6 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_b0._M_string_length - local_d0._M_string_length)) {
        uVar6 = local_b0._M_string_length - local_d0._M_string_length;
      }
      if (0x7ffffffe < (long)uVar6) {
        uVar6 = 0;
      }
    }
    else {
      uVar4 = memcmp(local_b0._M_dataplus._M_p,local_d0._M_dataplus._M_p,sVar7);
      uVar6 = (ulong)uVar4;
      if (uVar4 == 0) goto LAB_0011c543;
    }
    value = (bool)((byte)(uVar6 >> 0x1f) & 1);
    break;
  default:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unknown Operator: ","");
    pcVar2 = (op->Literal)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (op->Literal)._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_70," invalid operation on type string");
    newError(this,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    _Var8._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0011c630;
    goto LAB_0011c619;
  case PLUS:
    t = (Object *)operator_new(0x38);
    std::operator+(&local_90,&local_b0,&local_d0);
    t->_type = STRINGTYPE;
    t->_vptr_Object = (_func_int **)&PTR_type_00179ce0;
    t[1]._vptr_Object = (_func_int **)(t + 2);
    paVar1 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar1) {
      t[2]._vptr_Object =
           (_func_int **)
           CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
      *(undefined8 *)&t[2]._type = local_90.field_2._8_8_;
    }
    else {
      t[1]._vptr_Object = (_func_int **)local_90._M_dataplus._M_p;
      t[2]._vptr_Object =
           (_func_int **)
           CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
    }
    *(size_type *)&t[1]._type = local_90._M_string_length;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    *(undefined4 *)&t[3]._vptr_Object = 0;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar1) goto LAB_0011c630;
    local_50.field_2._M_allocated_capacity =
         CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
    _Var8._M_p = local_90._M_dataplus._M_p;
LAB_0011c619:
    operator_delete(_Var8._M_p,local_50.field_2._M_allocated_capacity + 1);
    goto LAB_0011c630;
  }
  nativeBooleanObject(this,value);
LAB_0011c630:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalStringConcatenate(Token& op, GCPtr<Object> left, GCPtr<Object> right){
    auto leftValue = dynamic_cast<StringObject*>(left.raw())->value;
    auto rightValue = dynamic_cast<StringObject*>(right.raw())->value;
    switch (op.Type) {
    case TokenType::PLUS:
    {
        return new StringObject(leftValue + rightValue);
    }
    case TokenType::EQ:
        return nativeBooleanObject(leftValue  == rightValue);
    case TokenType::NOT_EQ:
        return nativeBooleanObject(leftValue  != rightValue);
    case TokenType::LT:
        return nativeBooleanObject(leftValue  < rightValue);
    case TokenType::GT:
        return nativeBooleanObject(leftValue  > rightValue);
    default:
        return newError("Unknown Operator: ", op.Literal + " invalid operation on type string");
    }
}